

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O0

void edir(char *dirname)

{
  int __fd;
  int iVar1;
  DIR *__dirp;
  int *piVar2;
  dirent *pdVar3;
  bool bVar4;
  uint local_2c;
  int i;
  dirent *d;
  DIR *dir;
  int wdir;
  char *dirname_local;
  
  __fd = open_read(".");
  if (__fd == -1) {
    fatal("unable to open current working directory");
  }
  iVar1 = chdir(dirname);
  if (iVar1 != 0) {
    fatal2("unable to switch to directory",dirname);
  }
  __dirp = opendir(".");
  if (__dirp == (DIR *)0x0) {
    fatal2("unable to open directory",dirname);
  }
  do {
    while( true ) {
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        pdVar3 = readdir(__dirp);
        if (pdVar3 == (dirent *)0x0) {
          piVar2 = __errno_location();
          if (*piVar2 != 0) {
            fatal2("unable to read directory",dirname);
          }
          closedir(__dirp);
          iVar1 = fchdir(__fd);
          if (iVar1 == -1) {
            fatal("unable to switch to starting directory");
          }
          close(__fd);
          return;
        }
      } while (pdVar3->d_name[0] == '.');
      iVar1 = openreadclose(pdVar3->d_name,&sa,0x100);
      if (iVar1 == -1) break;
LAB_00103877:
      if (sa.len == 0) {
        iVar1 = pathexec_env(pdVar3->d_name,(char *)0x0);
        if (iVar1 == 0) {
          die_nomem();
        }
      }
      else {
        sa.len = byte_chr(sa.s,sa.len,10);
        while( true ) {
          bVar4 = false;
          if ((sa.len != 0) && (bVar4 = true, sa.s[sa.len - 1] != ' ')) {
            bVar4 = sa.s[sa.len - 1] == '\t';
          }
          if (!bVar4) break;
          sa.len = sa.len - 1;
        }
        for (local_2c = 0; local_2c < sa.len; local_2c = local_2c + 1) {
          if (sa.s[(int)local_2c] == '\0') {
            sa.s[(int)local_2c] = '\n';
          }
        }
        iVar1 = stralloc_append(&sa,"");
        if (iVar1 == 0) {
          die_nomem();
        }
        iVar1 = pathexec_env(pdVar3->d_name,sa.s);
        if (iVar1 == 0) {
          die_nomem();
        }
      }
    }
    piVar2 = __errno_location();
    if ((*piVar2 != error_isdir) || (env_dir == (char *)0x0)) {
      strerr_die(0x6f,"chpst: fatal: ","unable to read ",dirname,"/",pdVar3->d_name,": ",&strerr_sys
                );
      goto LAB_00103877;
    }
    if (verbose != 0) {
      strerr_warn("chpst: warning: ","unable to read ",dirname,"/",pdVar3->d_name,": ",&strerr_sys);
    }
  } while( true );
}

Assistant:

void edir(const char *dirname) {
  int wdir;
  DIR *dir;
  direntry *d;
  int i;

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");
  if (chdir(dirname)) fatal2("unable to switch to directory", dirname);
  if (! (dir =opendir("."))) fatal2("unable to open directory", dirname);
  for (;;) {
    errno =0;
    d =readdir(dir);
    if (! d) {
      if (errno) fatal2("unable to read directory", dirname);
      break;
    }
    if (d->d_name[0] == '.') continue;
    if (openreadclose(d->d_name, &sa, 256) == -1) {
      if ((errno == error_isdir) && env_dir) {
        if (verbose)
          strerr_warn6(WARNING, "unable to read ", dirname, "/",
                       d->d_name, ": ", &strerr_sys);
        continue;
      }
      else
        strerr_die6sys(111, FATAL, "unable to read ", dirname, "/",
                             d->d_name, ": ");
    }
    if (sa.len) {
      sa.len =byte_chr(sa.s, sa.len, '\n');
      while (sa.len && (sa.s[sa.len -1] == ' ' || sa.s[sa.len -1] == '\t'))
        --sa.len;
      for (i =0; i < sa.len; ++i) if (! sa.s[i]) sa.s[i] ='\n';
      if (! stralloc_0(&sa)) die_nomem();
      if (! pathexec_env(d->d_name, sa.s)) die_nomem();
    }
    else
      if (! pathexec_env(d->d_name, 0)) die_nomem();
  }
  closedir(dir);
  if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
  close(wdir);
}